

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O1

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,Book *book)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  double dVar3;
  bool bVar4;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> patron_00;
  undefined8 *puVar5;
  long *plVar6;
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> this_00;
  size_type *psVar7;
  ulong *puVar8;
  undefined8 uVar9;
  stringstream ss;
  string local_260;
  string local_240;
  Patron *local_220;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  undefined1 local_1c8 [24];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  Date local_170;
  bool local_168;
  _Alloc_hider local_160;
  ios_base local_158 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  double local_120;
  Date local_118 [25];
  string local_50;
  
  patron_00 = std::
              __find_if<__gnu_cxx::__normal_iterator<Patron*,std::vector<Patron,std::allocator<Patron>>>,__gnu_cxx::__ops::_Iter_equals_val<Patron_const>>
                        ((this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl
                         .super__Vector_impl_data._M_start,
                         (this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl
                         .super__Vector_impl_data._M_finish);
  local_220 = patron_00._M_current;
  if (patron_00._M_current ==
      (this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Patron::get_name_abi_cxx11_(&local_240,patron);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0x1170a8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_260.field_2._M_allocated_capacity = *psVar7;
      local_260.field_2._8_8_ = puVar5[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar7;
      local_260._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_260._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      local_1c8._0_8_ = *psVar7;
      local_1c8._8_8_ = plVar6[3];
      local_1d8 = (undefined1  [8])local_1c8;
    }
    else {
      local_1c8._0_8_ = *psVar7;
      local_1d8 = (undefined1  [8])*plVar6;
    }
    local_1d0._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    error((string *)local_1d8);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8,local_1c8._0_8_ + 1);
    }
    patron_00._M_current = local_220;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = std::
            __find_if<__gnu_cxx::__normal_iterator<Book*,std::vector<Book,std::allocator<Book>>>,__gnu_cxx::__ops::_Iter_equals_val<Book_const>>
                      (*(undefined8 *)&this->books,*(undefined8 *)&this->field_0x20,book);
  if (this_00._M_current == *(Book **)&this->field_0x20) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    operator<<((ostream *)local_1c8,book);
    Book::get_isbn_abi_cxx11_(&local_218,book);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x1170f4);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_240.field_2._M_allocated_capacity = *puVar8;
      local_240.field_2._8_8_ = plVar6[3];
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = *puVar8;
      local_240._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_240._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_260.field_2._M_allocated_capacity = *psVar7;
      local_260.field_2._8_8_ = puVar5[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar7;
      local_260._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_260._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    error(&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    patron_00._M_current = local_220;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  bVar4 = owes_fees(patron_00._M_current);
  if (!bVar4) goto LAB_001138b0;
  Patron::get_name_abi_cxx11_(&local_50,patron_00._M_current);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x117134);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_218.field_2._M_allocated_capacity = *psVar7;
    local_218.field_2._8_8_ = plVar6[3];
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar7;
    local_218._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_218._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_218);
  paVar1 = &local_240.field_2;
  puVar8 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_240.field_2._M_allocated_capacity = *puVar8;
    local_240.field_2._8_8_ = plVar6[3];
    local_240._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_240.field_2._M_allocated_capacity = *puVar8;
    local_240._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_240._M_string_length = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  dVar3 = Patron::get_fees(patron_00._M_current);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_1f8,vsnprintf,0x148,"%f",SUB84(dVar3,0))
  ;
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    uVar9 = local_240.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1f8._M_string_length + local_240._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      uVar9 = local_1f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1f8._M_string_length + local_240._M_string_length) goto LAB_00113731;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_240._M_dataplus._M_p);
  }
  else {
LAB_00113731:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1f8._M_dataplus._M_p);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_260.field_2._M_allocated_capacity = *psVar7;
    local_260.field_2._8_8_ = puVar5[3];
  }
  else {
    local_260.field_2._M_allocated_capacity = *psVar7;
    local_260._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_260._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    local_1c8._0_8_ = *psVar7;
    local_1c8._8_8_ = plVar6[3];
    local_1d8 = (undefined1  [8])local_1c8;
  }
  else {
    local_1c8._0_8_ = *psVar7;
    local_1d8 = (undefined1  [8])*plVar6;
  }
  local_1d0._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  error((string *)local_1d8);
  if (local_1d8 != (undefined1  [8])local_1c8) {
    operator_delete((void *)local_1d8,local_1c8._0_8_ + 1);
  }
  patron_00._M_current = local_220;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_001138b0:
  bVar4 = Book::is_checked_out(this_00._M_current);
  if (bVar4) {
    local_1d8 = (undefined1  [8])local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,
               "Error in Library::checkout_book() - Requested book is already checked out.","");
    error((string *)local_1d8);
    patron_00._M_current = local_220;
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8,local_1c8._0_8_ + 1);
      patron_00._M_current = local_220;
    }
  }
  Book::check_out(this_00._M_current);
  local_1d8._0_4_ = (this_00._M_current)->genre;
  local_1d0._M_p = local_1c8 + 8;
  pcVar2 = ((this_00._M_current)->isbn)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + ((this_00._M_current)->isbn)._M_string_length);
  local_1b0._M_p = (pointer)&local_1a0;
  pcVar2 = ((this_00._M_current)->title)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + ((this_00._M_current)->title)._M_string_length);
  local_190._M_p = (pointer)&local_180;
  pcVar2 = ((this_00._M_current)->author)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar2,pcVar2 + ((this_00._M_current)->author)._M_string_length);
  local_168 = (this_00._M_current)->is_chkd_out;
  local_170.days = ((this_00._M_current)->copyright_date).days;
  local_160._M_p = (pointer)&local_150;
  pcVar2 = ((patron_00._M_current)->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar2,pcVar2 + ((patron_00._M_current)->name)._M_string_length);
  pcVar2 = ((patron_00._M_current)->card_number)._M_dataplus._M_p;
  local_140._M_p = (pointer)&local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,
             pcVar2 + ((patron_00._M_current)->card_number)._M_string_length);
  local_120 = (patron_00._M_current)->fees;
  Date::Date(local_118);
  std::vector<Transaction,_std::allocator<Transaction>_>::emplace_back<Transaction>
            (&this->transactions,(Transaction *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if (local_1d0._M_p != local_1c8 + 8) {
    operator_delete(local_1d0._M_p,local_1c8._8_8_ + 1);
  }
  __return_storage_ptr__->genre = (this_00._M_current)->genre;
  (__return_storage_ptr__->isbn)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->isbn).field_2
  ;
  pcVar2 = ((this_00._M_current)->isbn)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->isbn,pcVar2,
             pcVar2 + ((this_00._M_current)->isbn)._M_string_length);
  (__return_storage_ptr__->title)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->title).field_2;
  pcVar2 = ((this_00._M_current)->title)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->title,pcVar2,
             pcVar2 + ((this_00._M_current)->title)._M_string_length);
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  pcVar2 = ((this_00._M_current)->author)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->author,pcVar2,
             pcVar2 + ((this_00._M_current)->author)._M_string_length);
  __return_storage_ptr__->is_chkd_out = (this_00._M_current)->is_chkd_out;
  (__return_storage_ptr__->copyright_date).days = ((this_00._M_current)->copyright_date).days;
  return __return_storage_ptr__;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const Book& book)
{
	auto found_patron = std::find(
		patrons.begin(), patrons.end(), patron
	);
	if (found_patron == patrons.end())
		error("Error in Library::checkout_book() - Patron with name '"
			+ patron.get_name() 
			+ "' is not registered.");
	auto found_book = std::find(
		books.begin(), books.end(), book
	);
	if (found_book == books.end())
	{
		std::stringstream ss;
		ss << book;
		error("Error in Library::checkout_book() - Book with ISBN="
			+ book.get_isbn() + " not found.");
	}
	if (owes_fees(*found_patron))
		error("Error in Library::checkout_book() - "
			+ found_patron->get_name()
			+ " owes fee: "
			+ std::to_string(found_patron->get_fees())
			+ "$.");
	if (found_book->is_checked_out())
		error("Error in Library::checkout_book() - Requested book is already checked out.");
	found_book->check_out();
	transactions.push_back(Transaction{ *found_book, *found_patron, Date{} });
	return *found_book;
}